

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  pointer ppcVar2;
  cmCPackIFWGenerator *pcVar3;
  cmCPackLog *pcVar4;
  _Alloc_hider _Var5;
  cmCPackComponent *pcVar6;
  bool bVar7;
  int iVar8;
  long *plVar9;
  mapped_type *pmVar10;
  cmValue cVar11;
  mapped_type *__v;
  ostream *poVar12;
  size_t sVar13;
  size_type *psVar14;
  char *pcVar15;
  iterator __begin2;
  pointer ppcVar16;
  char *pcVar17;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1f0;
  string local_1d0;
  undefined1 local_1b0 [112];
  ios_base local_140 [264];
  cmCPackComponent *local_38;
  
  if (component == (cmCPackComponent *)0x0) {
    iVar8 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1d0,&component->Name);
    plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x8093b1);
    pcVar1 = local_1b0 + 0x10;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((size_type *)*plVar9 == psVar14) {
      local_1b0._16_8_ = *psVar14;
      local_1b0._24_8_ = plVar9[3];
      local_1b0._0_8_ = pcVar1;
    }
    else {
      local_1b0._16_8_ = *psVar14;
      local_1b0._0_8_ = (size_type *)*plVar9;
    }
    local_1b0._8_8_ = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    plVar9 = (long *)std::__cxx11::string::append(local_1b0);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    psVar14 = (size_type *)(plVar9 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar9 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_1f0.field_2._M_allocated_capacity = *psVar14;
      local_1f0.field_2._8_8_ = plVar9[3];
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar14;
      local_1f0._M_dataplus._M_p = (pointer)*plVar9;
    }
    local_1f0._M_string_length = plVar9[1];
    *plVar9 = (long)psVar14;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
      operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->DisplayName,(key_type *)local_1b0);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"");
    pmVar10 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->Description,(key_type *)local_1b0);
    std::__cxx11::string::_M_assign((string *)pmVar10);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (cVar11.Value == (string *)0x0) {
      local_1b0._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"CPACK_PACKAGE_VERSION","");
      cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
      if ((pointer)local_1b0._0_8_ != pcVar1) {
        operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
      }
      if (cVar11.Value == (string *)0x0) {
        std::__cxx11::string::_M_replace
                  ((ulong)&this->Version,0,(char *)(this->Version)._M_string_length,0x80957b);
      }
      else {
        std::__cxx11::string::_M_assign((string *)&this->Version);
      }
    }
    else {
      std::__cxx11::string::_M_assign((string *)&this->Version);
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->Script);
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->UserInterfaces,
                        (this->UserInterfaces).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      cmList::Insert(&this->UserInterfaces,
                     (this->UserInterfaces).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,cVar11.Value,Yes,No);
    }
    ppcVar16 = (component->Dependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppcVar2 = (component->Dependencies).
              super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    local_38 = component;
    if (ppcVar16 != ppcVar2) {
      do {
        local_1b0._0_8_ = *ppcVar16;
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,
                           (key_type *)local_1b0);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
        ppcVar16 = ppcVar16 + 1;
      } while (ppcVar16 != ppcVar2);
    }
    pcVar1 = local_1b0 + 0x10;
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    pcVar6 = local_38;
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_00,(this->Licenses).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      cmList::Insert(this_00,(this->Licenses).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish,cVar11.Value,Yes,No);
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
        poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1b0,local_1f0._M_dataplus._M_p,
                             local_1f0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar12,"LICENSES",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar12," should contain pairs of <display_name> and <file_path>.",0x38);
        std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
        std::ostream::put((char)poVar12);
        std::ostream::flush();
        pcVar3 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar3 != (cmCPackIFWGenerator *)0x0) {
          pcVar4 = (pcVar3->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var5._M_p = local_1d0._M_dataplus._M_p;
          sVar13 = strlen(local_1d0._M_dataplus._M_p);
          cmCPackLog::Log(pcVar4,8,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xf4,_Var5._M_p,sVar13);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
            operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
        std::ios_base::~ios_base(local_140);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    cVar11 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (cVar11.Value != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)&this->SortingPriority);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"The \"PRIORITY\" option is set ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1b0,"for component \"",0xf);
      poVar12 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1b0,(pcVar6->Name)._M_dataplus._M_p,
                           (pcVar6->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar12,"\", but there option is ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar12,"deprecated. Please use \"SORTING_PRIORITY\" option instead.",0x39);
      std::ios::widen((char)poVar12->_vptr_basic_ostream[-3] + (char)poVar12);
      std::ostream::put((char)poVar12);
      std::ostream::flush();
      pcVar3 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar3 != (cmCPackIFWGenerator *)0x0) {
        pcVar4 = (pcVar3->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var5._M_p = local_1d0._M_dataplus._M_p;
        sVar13 = strlen(local_1d0._M_dataplus._M_p);
        cmCPackLog::Log(pcVar4,8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0x101,_Var5._M_p,sVar13);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b0);
      std::ios_base::~ios_base(local_140);
    }
    pcVar17 = "false";
    pcVar15 = "false";
    if ((pcVar6->field_0x48 & 4) == 0) {
      pcVar15 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,(ulong)pcVar15);
    local_1b0._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1b0,local_1f0._M_dataplus._M_p,
               local_1f0._M_dataplus._M_p + local_1f0._M_string_length);
    std::__cxx11::string::append(local_1b0);
    bVar7 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_1b0);
    if ((pointer)local_1b0._0_8_ != pcVar1) {
      operator_delete((void *)local_1b0._0_8_,local_1b0._16_8_ + 1);
    }
    if (bVar7) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->Essential,0,(char *)(this->Essential)._M_string_length,0x807e77);
    }
    pcVar15 = "";
    if ((pcVar6->field_0x48 & 2) != 0) {
      pcVar15 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,(ulong)pcVar15);
    if ((pcVar6->field_0x48 & 1) != 0) {
      pcVar17 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->ForcedInstallation,0,
               (char *)(this->ForcedInstallation)._M_string_length,(ulong)pcVar17);
    ConfigureFromPrefix(this,&local_1f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
    }
    iVar8 = 1;
  }
  return iVar8;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore default configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (cmValue optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = *optVERSION;
  } else if (cmValue optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = *optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (cmValue option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = *option;
  }

  // User interfaces
  if (cmValue option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmExpandList(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    for (cmCPackComponent* dep : component->Dependencies) {
      this->Dependencies.insert(this->Generator->ComponentPackages[dep]);
    }
  }

  // Licenses
  if (cmValue option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmExpandList(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (cmValue option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = *option;
    cmCPackIFWLogger(
      WARNING,
      "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}